

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenu::setDefaultAction(QMenu *this,QAction *act)

{
  QWeakPointer<QObject>::assign<QObject>
            ((QWeakPointer<QObject> *)(*(long *)&(this->super_QWidget).field_0x8 + 0x398),
             (QObject *)act);
  return;
}

Assistant:

void QMenu::setDefaultAction(QAction *act)
{
    d_func()->defaultAction = act;
}